

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextbrowser.cpp
# Opt level: O2

QString * __thiscall
QTextBrowserPrivate::findFile(QString *__return_storage_ptr__,QTextBrowserPrivate *this,QUrl *name)

{
  undefined8 uVar1;
  qsizetype qVar2;
  bool bVar3;
  char cVar4;
  QArrayDataPointer<char16_t> *pQVar5;
  long lVar6;
  char16_t *pcVar7;
  Data *pDVar8;
  QTypedArrayData<char16_t> *__old_val;
  Data *pDVar9;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_b8;
  Data *local_98;
  char16_t *local_90;
  undefined1 auStack_88 [32];
  char16_t *local_68;
  Data *pDStack_60;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d = (Data *)0x0;
  local_58.ptr = (char16_t *)0x0;
  local_58.size = 0;
  QUrl::scheme();
  auStack_88._24_8_ = (Data *)0x3;
  local_68 = L"qrc";
  bVar3 = ::operator==((QString *)&local_98,(QLatin1StringView *)(auStack_88 + 0x18));
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
  if (bVar3) {
    pQVar5 = &local_b8;
    QUrl::path(pQVar5,name,0x7f00000);
    auStack_88._16_8_ = local_b8.size;
    auStack_88._8_8_ = local_b8.ptr;
    auStack_88._0_8_ = local_b8.d;
    local_98 = (Data *)0x2;
    local_90 = L":/";
    local_b8.d = (Data *)0x0;
    local_b8.ptr = (char16_t *)0x0;
    local_b8.size = 0;
    QStringBuilder<QLatin1String,_QString>::convertTo<QString>
              ((QString *)(auStack_88 + 0x18),(QStringBuilder<QLatin1String,_QString> *)&local_98);
    pDVar8 = pDStack_60;
    pcVar7 = local_68;
    pDVar9 = (Data *)auStack_88._24_8_;
    local_58.d = (Data *)auStack_88._24_8_;
    auStack_88._24_8_ = (Data *)0x0;
    local_58.ptr = local_68;
    local_68 = (char16_t *)0x0;
    pDStack_60 = (Data *)0x0;
    local_58.size = (qsizetype)pDVar8;
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)(auStack_88 + 0x18));
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)auStack_88);
  }
  else {
    QUrl::scheme();
    uVar1 = auStack_88._0_8_;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
    pQVar5 = (QArrayDataPointer<char16_t> *)&local_98;
    if ((Data *)uVar1 == (Data *)0x0) {
      QUrl::path(pQVar5,name,0x7f00000);
    }
    else {
      QUrl::toLocalFile();
    }
    pDVar8 = (Data *)auStack_88._0_8_;
    pcVar7 = local_90;
    pDVar9 = local_98;
    local_58.d = local_98;
    local_98 = (Data *)0x0;
    local_58.ptr = local_90;
    local_90 = (char16_t *)0x0;
    auStack_88._0_8_ = (Data *)0x0;
    local_58.size = (qsizetype)pDVar8;
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(pQVar5);
  if (pDVar8 == (Data *)0x0) {
    local_58.d = (Data *)0x0;
    local_58.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).d = pDVar9;
    local_58.size = 0;
    (__return_storage_ptr__->d).ptr = pcVar7;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    QFileInfo::QFileInfo((QFileInfo *)&local_98,(QString *)&local_58);
    bVar3 = QFileInfo::isAbsolute((QFileInfo *)&local_98);
    QFileInfo::~QFileInfo((QFileInfo *)&local_98);
    if (!bVar3) {
      pQVar5 = &((this->searchPaths).d.ptr)->d;
      for (lVar6 = (this->searchPaths).d.size * 0x18; lVar6 != 0; lVar6 = lVar6 + -0x18) {
        (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,pQVar5);
        cVar4 = QString::endsWith((QChar)(char16_t)__return_storage_ptr__,0x2f);
        if (cVar4 == '\0') {
          QString::append((QChar)(char16_t)__return_storage_ptr__);
        }
        QString::append((QString *)__return_storage_ptr__);
        QFileInfo::QFileInfo((QFileInfo *)&local_98,(QString *)__return_storage_ptr__);
        cVar4 = QFileInfo::isReadable();
        QFileInfo::~QFileInfo((QFileInfo *)&local_98);
        if (cVar4 != '\0') goto LAB_004651d0;
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&__return_storage_ptr__->d);
        pQVar5 = pQVar5 + 1;
      }
    }
    qVar2 = local_58.size;
    pcVar7 = local_58.ptr;
    pDVar9 = local_58.d;
    local_58.d = (Data *)0x0;
    local_58.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).d = pDVar9;
    (__return_storage_ptr__->d).ptr = pcVar7;
    local_58.size = 0;
    (__return_storage_ptr__->d).size = qVar2;
  }
LAB_004651d0:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QTextBrowserPrivate::findFile(const QUrl &name) const
{
    QString fileName;
    if (name.scheme() == "qrc"_L1) {
        fileName = ":/"_L1 + name.path();
    } else if (name.scheme().isEmpty()) {
        fileName = name.path();
    } else {
#if defined(Q_OS_ANDROID)
        if (name.scheme() == "assets"_L1)
            fileName = "assets:"_L1 + name.path();
        else
#endif
            fileName = name.toLocalFile();
    }

    if (fileName.isEmpty())
        return fileName;

    if (QFileInfo(fileName).isAbsolute())
        return fileName;

    for (QString path : std::as_const(searchPaths)) {
        if (!path.endsWith(u'/'))
            path.append(u'/');
        path.append(fileName);
        if (QFileInfo(path).isReadable())
            return path;
    }

    return fileName;
}